

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatterMeshless.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChMatterMeshless::IntLoadResidual_Mv
          (ChMatterMeshless *this,uint off,ChVectorDynamic<> *R,ChVectorDynamic<> *w,double c)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  pointer psVar5;
  int iVar6;
  uint uVar7;
  CoeffReturnType pdVar8;
  Scalar *pSVar9;
  ulong uVar10;
  ulong index;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  
  index = (ulong)off;
  uVar7 = 0;
  while( true ) {
    uVar10 = (ulong)uVar7;
    psVar5 = (this->nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->nodes).
                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar5 >> 4) <= uVar10)
    break;
    dVar11 = (double)(**(code **)(*(long *)&(psVar5[uVar10].
                                             super___shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr)->super_ChNodeXYZ + 0x90))();
    pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)w,index);
    dVar1 = *pdVar8;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)R,index);
    auVar12._8_8_ = 0;
    auVar12._0_8_ = dVar11 * c;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = dVar1;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = *pSVar9;
    auVar2 = vfmadd213sd_fma(auVar15,auVar12,auVar2);
    *pSVar9 = auVar2._0_8_;
    dVar11 = (double)(**(code **)(*(long *)&((this->nodes).
                                             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[uVar10].
                                             super___shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr)->super_ChNodeXYZ + 0x90))();
    iVar6 = (int)index;
    pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)w,
                        (ulong)(iVar6 + 1));
    dVar1 = *pdVar8;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)R,
                        (ulong)(iVar6 + 1));
    auVar13._8_8_ = 0;
    auVar13._0_8_ = dVar11 * c;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = dVar1;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = *pSVar9;
    auVar2 = vfmadd213sd_fma(auVar16,auVar13,auVar3);
    *pSVar9 = auVar2._0_8_;
    dVar11 = (double)(**(code **)(*(long *)&((this->nodes).
                                             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[uVar10].
                                             super___shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr)->super_ChNodeXYZ + 0x90))();
    pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)w,
                        (ulong)(iVar6 + 2));
    dVar1 = *pdVar8;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)R,
                        (ulong)(iVar6 + 2));
    auVar14._8_8_ = 0;
    auVar14._0_8_ = dVar11 * c;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = dVar1;
    index = (ulong)(iVar6 + 3);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = *pSVar9;
    auVar2 = vfmadd213sd_fma(auVar17,auVar14,auVar4);
    *pSVar9 = auVar2._0_8_;
    uVar7 = uVar7 + 1;
  }
  return;
}

Assistant:

void ChMatterMeshless::IntLoadResidual_Mv(const unsigned int off,      ///< offset in R residual
                                          ChVectorDynamic<>& R,        ///< result: the R residual, R += c*M*v
                                          const ChVectorDynamic<>& w,  ///< the w vector
                                          const double c               ///< a scaling factor
                                          ) {
    for (unsigned int j = 0; j < nodes.size(); j++) {
        R(off + 3 * j) += c * nodes[j]->GetMass() * w(off + 3 * j);
        R(off + 3 * j + 1) += c * nodes[j]->GetMass() * w(off + 3 * j + 1);
        R(off + 3 * j + 2) += c * nodes[j]->GetMass() * w(off + 3 * j + 2);
    }
}